

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuKeypairGen(octet *privkey,octet *pubkey,dstu_params *params,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  size_t sVar2;
  ulong n;
  code *in_RCX;
  word *in_RDX;
  ec_o *in_RSI;
  word *in_RDI;
  void *in_R8;
  void *stack;
  word *y;
  word *x;
  word *d;
  ec_o *ec;
  size_t order_nb;
  size_t order_no;
  size_t order_n;
  err_t code;
  size_t in_stack_ffffffffffffff88;
  size_t *src;
  word *in_stack_ffffffffffffff90;
  ec_o *ec_00;
  word *a;
  word *a_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  if (in_RCX == (code *)0x0) {
    eVar3 = 0x130;
  }
  else {
    eVar3 = dstuEcCreate((ec_o **)order_nb,(dstu_params *)ec,(dstu_deep_i)d);
    if (eVar3 == 0) {
      sVar2 = wwBitSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      n = sVar2 + 0x3f >> 6;
      bVar1 = memIsValid(in_RDI,sVar2 + 7 >> 3);
      if ((bVar1 == 0) ||
         (bVar1 = memIsValid(in_RSI,*(long *)(lRam0000000000000018 + 0x38) << 1), bVar1 == 0)) {
        dstuEcClose((ec_o *)0x16526e);
        eVar3 = 0x6d;
      }
      else {
        a = pwRam0000000000000000 + *(long *)(lRam0000000000000018 + 0x30);
        ec_00 = (ec_o *)(a + *(long *)(lRam0000000000000018 + 0x30));
        src = &(ec_00->hdr).keep + *(long *)(lRam0000000000000018 + 0x30);
        a_00 = pwRam0000000000000000;
        wwSetZero(pwRam0000000000000000,n);
        do {
          (*in_RCX)(a_00,sVar2 + 7 >> 3,in_R8);
          u64From((u64 *)ec_00,src,0x16532f);
          wwTrimHi(a_00,n,sVar2 - 1);
          bVar1 = wwIsZero(a_00,n);
        } while (bVar1 != 0);
        bVar1 = ecMulA((word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       in_RSI,in_RDX,(size_t)in_RCX,in_R8);
        if (bVar1 == 0) {
          dstuEcClose((ec_o *)0x165394);
          eVar3 = 0x1f6;
        }
        else {
          ec2NegA(a_00,a,ec_00);
          u64To(ec_00,(size_t)src,(u64 *)0x1653c9);
          (**(code **)(lRam0000000000000018 + 0x48))(in_RSI,a,lRam0000000000000018,src);
          (**(code **)(lRam0000000000000018 + 0x48))
                    ((long)&(in_RSI->hdr).keep + *(long *)(lRam0000000000000018 + 0x38),ec_00,
                     lRam0000000000000018,src);
          dstuEcClose((ec_o *)0x16542c);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t dstuKeypairGen(octet privkey[], octet pubkey[], 
	const dstu_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* d;
	word* x;
	word* y;
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuKeypairGen_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	if (!memIsValid(privkey, order_no) || 
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	x = d + ec->f->n;
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// d <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка d]
	wwSetZero(d, order_n);
	while (1)
	{
		rng(d, O_OF_B(order_nb), rng_state);
		wwFrom(d, d, O_OF_B(order_nb));
		wwTrimHi(d, order_n, order_nb - 1);
		ASSERT(wwCmp(d, ec->order, order_n) < 0);
		// 0 < d?
		if (!wwIsZero(d, order_n))
			break;
	}
	// Q <- d G
	if (!ecMulA(x, ec->base, ec, d, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// Q <- -Q
	ec2NegA(x, x, ec);
	// выгрузить ключи
	wwTo(privkey, order_no, d);
	qrTo(pubkey, x, ec->f, stack);
	qrTo(pubkey + ec->f->no, y, ec->f, stack);
	// все нормально
	dstuEcClose(ec);
	return code;
}